

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (timestamp_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  timestamp_t tVar2;
  timestamp_t tVar3;
  ulong uVar4;
  timestamp_t *extraout_RDX;
  timestamp_t *extraout_RDX_00;
  timestamp_t *ptVar5;
  timestamp_t *extraout_RDX_01;
  int64_t *piVar6;
  ulong uVar7;
  idx_t iVar8;
  timestamp_t lentry;
  timestamp_t lentry_1;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t interval;
  interval_t interval_00;
  interval_t iVar12;
  int64_t *local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      tVar3 = (timestamp_t)ldata->value;
      local_70 = &rdata->micros;
      iVar8 = 0;
      ptVar5 = result_data;
      do {
        iVar12.micros = (int64_t)ptVar5;
        iVar12._0_8_ = *local_70;
        iVar12 = Interval::Invert(*(Interval **)(local_70 + -1),iVar12);
        tVar2 = Interval::Add(tVar3,iVar12);
        result_data[iVar8].value = tVar2.value;
        iVar8 = iVar8 + 1;
        local_70 = local_70 + 2;
        ptVar5 = extraout_RDX_01;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    ptVar5 = result_data;
    uVar11 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[uVar4];
      }
      uVar10 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar10 = count;
      }
      uVar7 = uVar10;
      if (uVar9 != 0) {
        uVar7 = uVar11;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar11 < uVar10) {
            tVar3 = (timestamp_t)ldata->value;
            piVar6 = &rdata[uVar11].micros;
            do {
              interval.micros = (int64_t)ptVar5;
              interval._0_8_ = *piVar6;
              iVar12 = Interval::Invert(*(Interval **)(piVar6 + -1),interval);
              tVar2 = Interval::Add(tVar3,iVar12);
              result_data[uVar11].value = tVar2.value;
              uVar11 = uVar11 + 1;
              piVar6 = piVar6 + 2;
              ptVar5 = extraout_RDX;
              uVar7 = uVar11;
            } while (uVar10 != uVar11);
          }
        }
        else if (uVar11 < uVar10) {
          piVar6 = &rdata[uVar11].micros;
          uVar7 = 0;
          do {
            if ((uVar9 >> (uVar7 & 0x3f) & 1) != 0) {
              tVar3 = (timestamp_t)ldata->value;
              interval_00.micros = (int64_t)ptVar5;
              interval_00._0_8_ = *piVar6;
              iVar12 = Interval::Invert(*(Interval **)(piVar6 + -1),interval_00);
              tVar3 = Interval::Add(tVar3,iVar12);
              result_data[uVar11 + uVar7].value = tVar3.value;
              ptVar5 = extraout_RDX_00;
            }
            uVar7 = uVar7 + 1;
            piVar6 = piVar6 + 2;
          } while ((uVar11 - uVar10) + uVar7 != 0);
          uVar7 = uVar11 + uVar7;
        }
      }
      uVar4 = uVar4 + 1;
      uVar11 = uVar7;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}